

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O1

lys_node * resolve_choice_dflt(lys_node_choice *choic,char *dflt)

{
  LYS_NODE LVar1;
  lys_node_choice *choic_00;
  lys_node *plVar2;
  
  choic_00 = (lys_node_choice *)choic->child;
  while( true ) {
    if (choic_00 == (lys_node_choice *)0x0) {
      return (lys_node *)0x0;
    }
    LVar1 = choic_00->nodetype;
    if ((LVar1 == LYS_USES) &&
       (plVar2 = resolve_choice_dflt(choic_00,dflt), plVar2 != (lys_node *)0x0)) break;
    if (((LVar1 & 0x807f) != LYS_UNKNOWN) && (choic_00->name == dflt)) {
      return (lys_node *)choic_00;
    }
    choic_00 = (lys_node_choice *)choic_00->next;
  }
  return plVar2;
}

Assistant:

static struct lys_node *
resolve_choice_dflt(struct lys_node_choice *choic, const char *dflt)
{
    struct lys_node *child, *ret;

    LY_TREE_FOR(choic->child, child) {
        if (child->nodetype == LYS_USES) {
            ret = resolve_choice_dflt((struct lys_node_choice *)child, dflt);
            if (ret) {
                return ret;
            }
        }

        if (ly_strequal(child->name, dflt, 1) && (child->nodetype & (LYS_ANYDATA | LYS_CASE
                | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_CHOICE))) {
            return child;
        }
    }

    return NULL;
}